

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O0

vector * __thiscall lsh::table::query(vector *__return_storage_ptr__,table *this,vector *v)

{
  uint uVar1;
  const_iterator this_00;
  bool bVar2;
  uint uVar3;
  invalid_argument *this_01;
  size_type sVar4;
  const_reference this_02;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
  this_03;
  mapped_type *this_04;
  reference puVar5;
  vector<bool,_std::allocator<bool>_> local_f8;
  uint local_c4;
  mapped_type *pmStack_c0;
  uint d;
  vector *c;
  const_iterator cStack_b0;
  uint u;
  const_iterator __end2;
  const_iterator __begin2;
  bucket *__range2;
  mapped_type *local_90;
  bucket *b;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
  local_80;
  uint local_74;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
  local_70;
  const_iterator it;
  partition *p;
  vector k;
  uint i;
  uint best_d;
  vector *best_c;
  uint n;
  vector *v_local;
  table *this_local;
  
  uVar1 = this->dimensions_;
  uVar3 = lsh::vector::size(v);
  if (uVar1 == uVar3) {
    sVar4 = std::
            vector<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::allocator<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
            ::size(&this->partitions_);
    _i = (vector *)0x0;
    k.components_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0xffffffff;
    for (k.components_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        (uint)k.components_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage < (uint)sVar4;
        k.components_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ =
             (uint)k.components_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
      this_02 = std::vector<lsh::vector,_std::allocator<lsh::vector>_>::operator[]
                          (&this->masks_,
                           (ulong)(uint)k.components_.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      lsh::vector::operator&((vector *)&p,this_02,v);
      this_03._M_cur =
           (__node_type *)
           std::
           vector<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::allocator<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
           ::operator[](&this->partitions_,
                        (ulong)(uint)k.components_.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      it.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
      ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                 )(_Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                   )this_03._M_cur;
      local_74 = lsh::vector::hash((vector *)&p);
      local_70._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::find((unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                   *)this_03._M_cur,&local_74);
      local_80._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::end(it.
                 super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                 ._M_cur);
      bVar2 = std::__detail::operator==(&local_70,&local_80);
      this_00 = it;
      if (bVar2) {
        b._4_4_ = 4;
      }
      else {
        __range2._4_4_ = lsh::vector::hash((vector *)&p);
        this_04 = std::
                  unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                  ::at((unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                        *)this_00.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                          ._M_cur,(key_type *)((long)&__range2 + 4));
        local_90 = this_04;
        __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_04);
        cStack_b0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_04);
        while (bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff50), bVar2) {
          puVar5 = __gnu_cxx::
                   __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator*(&__end2);
          c._4_4_ = *puVar5;
          pmStack_c0 = std::
                       unordered_map<unsigned_int,_lsh::vector,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_lsh::vector>_>_>
                       ::at(&this->vectors_,(key_type *)((long)&c + 4));
          local_c4 = lsh::vector::distance(v,pmStack_c0);
          if (local_c4 <
              k.components_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_) {
            _i = pmStack_c0;
            k.components_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ = local_c4;
          }
          __gnu_cxx::
          __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          ::operator++(&__end2);
        }
        b._4_4_ = 0;
      }
      lsh::vector::~vector((vector *)&p);
    }
    if (_i == (vector *)0x0) {
      local_f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_offset = 0;
      local_f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._12_4_ = 0;
      local_f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = 0;
      local_f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._12_4_ = 0;
      local_f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
      std::vector<bool,_std::allocator<bool>_>::vector(&local_f8);
      lsh::vector::vector(__return_storage_ptr__,&local_f8);
      std::vector<bool,_std::allocator<bool>_>::~vector(&local_f8);
    }
    else {
      lsh::vector::vector(__return_storage_ptr__,_i);
    }
    return __return_storage_ptr__;
  }
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_01,"Invalid vector size");
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

vector table::query(const vector& v) const {
    if (this->dimensions_ != v.size()) {
      throw std::invalid_argument("Invalid vector size");
    }

    unsigned int n = this->partitions_.size();

    // Keep track of the best candidate we've encountered.
    const vector* best_c = nullptr;

    // Keep track of the distance to the best candidate.
    unsigned int best_d = UINT_MAX;

    for (unsigned int i = 0; i < n; i++) {
      vector k = this->masks_[i] & v;
      const partition& p = this->partitions_[i];

      auto it = p.find(k.hash());

      if (it == p.end()) {
        continue;
      }

      const bucket& b = p.at(k.hash());

      for (unsigned int u: b) {
        const vector& c = this->vectors_.at(u);

        unsigned int d = vector::distance(v, c);

        if (d < best_d) {
          best_c = &c;
          best_d = d;
        }
      }
    }

    return best_c ? *best_c : vector({});
  }